

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_string.c
# Opt level: O2

wchar_t utf16_to_unicode(uint32_t *pwc,char *s,size_t n,wchar_t be)

{
  wchar_t wVar1;
  uchar *p;
  ushort uVar2;
  uint uVar3;
  char *utf16;
  uchar *p_2;
  ushort *puVar4;
  ushort uVar5;
  
  if (n == 0) {
    return L'\0';
  }
  if (n == 1) {
    *pwc = 0xfffd;
    wVar1 = L'\xffffffff';
  }
  else {
    if (be == L'\0') {
      uVar5 = *(ushort *)s;
    }
    else {
      uVar5 = *(ushort *)s << 8 | *(ushort *)s >> 8;
    }
    uVar3 = (uint)uVar5;
    puVar4 = (ushort *)(s + 2);
    if ((uVar5 & 0xfc00) != 0xd800) {
LAB_0013fe64:
      if (0x10ffff < uVar3 || (uVar3 & 0xfffff800) == 0xd800) {
        *pwc = 0xfffd;
        return (int)s - (int)puVar4;
      }
      *pwc = uVar3;
      return (int)puVar4 - (int)s;
    }
    if (3 < n) {
      if (be == L'\0') {
        uVar2 = *puVar4;
      }
      else {
        uVar2 = *(ushort *)(s + 2) << 8 | *(ushort *)(s + 2) >> 8;
      }
      if ((uVar2 & 0xfc00) == 0xdc00) {
        uVar3 = (uint)uVar5 * 0x400 + (uint)uVar2 + 0xfca02400;
        puVar4 = (ushort *)(s + 4);
        goto LAB_0013fe64;
      }
    }
    *pwc = 0xfffd;
    wVar1 = L'\xfffffffe';
  }
  return wVar1;
}

Assistant:

static int
utf16_to_unicode(uint32_t *pwc, const char *s, size_t n, int be)
{
	const char *utf16 = s;
	unsigned uc;

	if (n == 0)
		return (0);
	if (n == 1) {
		/* set the Replacement Character instead. */
		*pwc = UNICODE_R_CHAR;
		return (-1);
	}

	if (be)
		uc = archive_be16dec(utf16);
	else
		uc = archive_le16dec(utf16);
	utf16 += 2;
		
	/* If this is a surrogate pair, assemble the full code point.*/
	if (IS_HIGH_SURROGATE_LA(uc)) {
		unsigned uc2;

		if (n >= 4) {
			if (be)
				uc2 = archive_be16dec(utf16);
			else
				uc2 = archive_le16dec(utf16);
		} else
			uc2 = 0;
		if (IS_LOW_SURROGATE_LA(uc2)) {
			uc = combine_surrogate_pair(uc, uc2);
			utf16 += 2;
		} else {
	 		/* Undescribed code point should be U+FFFD
		 	* (replacement character). */
			*pwc = UNICODE_R_CHAR;
			return (-2);
		}
	}

	/*
	 * Surrogate pair values(0xd800 through 0xdfff) are only
	 * used by UTF-16, so, after above culculation, the code
	 * must not be surrogate values, and Unicode has no codes
	 * larger than 0x10ffff. Thus, those are not leagal Unicode
	 * values.
	 */
	if (IS_SURROGATE_PAIR_LA(uc) || uc > UNICODE_MAX) {
	 	/* Undescribed code point should be U+FFFD
	 	* (replacement character). */
		*pwc = UNICODE_R_CHAR;
		return (((int)(utf16 - s)) * -1);
	}
	*pwc = uc;
	return ((int)(utf16 - s));
}